

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnTableInitExpr(BinaryReaderIR *this,Index segment)

{
  Result RVar1;
  Location local_98;
  Var local_70;
  _Head_base<0UL,_wabt::Expr_*,_false> local_28;
  Expr *local_20;
  
  local_98.field_1.field_0.line = 0;
  local_98.field_1._4_8_ = 0;
  local_98.filename.data_ = (char *)0x0;
  local_98.filename.size_._0_4_ = 0;
  local_98.filename.size_._4_4_ = 0;
  Var::Var(&local_70,segment,&local_98);
  MakeUnique<wabt::VarExpr<(wabt::ExprType)40>,wabt::Var>((wabt *)&local_20,&local_70);
  local_28._M_head_impl = local_20;
  local_20 = (Expr *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_28);
  if (local_28._M_head_impl != (Expr *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Expr[1])();
  }
  if (local_20 != (Expr *)0x0) {
    (**(code **)(*(long *)local_20 + 8))();
  }
  local_20 = (Expr *)0x0;
  Var::~Var(&local_70);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnTableInitExpr(Index segment) {
  return AppendExpr(MakeUnique<TableInitExpr>(Var(segment)));
}